

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

FileDescriptorProto * __thiscall
perfetto::protos::gen::FileDescriptorProto::operator=
          (FileDescriptorProto *this,FileDescriptorProto *param_1)

{
  ::std::__cxx11::string::operator=((string *)&this->name_,(string *)&param_1->name_);
  ::std::__cxx11::string::operator=((string *)&this->package_,(string *)&param_1->package_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->dependency_,&param_1->dependency_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->public_dependency_,&param_1->public_dependency_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->weak_dependency_,&param_1->weak_dependency_);
  std::
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ::_M_move_assign(&this->message_type_,&param_1->message_type_);
  std::
  vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ::_M_move_assign(&this->enum_type_,&param_1->enum_type_);
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::_M_move_assign(&this->extension_,&param_1->extension_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool FileDescriptorProto::operator==(const FileDescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && package_ == other.package_
   && dependency_ == other.dependency_
   && public_dependency_ == other.public_dependency_
   && weak_dependency_ == other.weak_dependency_
   && message_type_ == other.message_type_
   && enum_type_ == other.enum_type_
   && extension_ == other.extension_;
}